

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_generator.cc
# Opt level: O2

void webrtc::WindowGenerator::Hanning(int length,float *window)

{
  string *result;
  ostream *poVar1;
  ulong uVar2;
  ulong uVar3;
  float fVar4;
  FatalMessage local_190;
  
  result = rtc::CheckGTImpl_abi_cxx11_(length,1,"length > 1");
  if (result != (string *)0x0) {
    rtc::FatalMessage::FatalMessage
              (&local_190,
               "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/common_audio/window_generator.cc"
               ,0x29,result);
    rtc::FatalMessage::~FatalMessage(&local_190);
  }
  if (window != (float *)0x0) {
    uVar3 = 0;
    uVar2 = (ulong)(uint)length;
    if (length < 1) {
      uVar2 = uVar3;
    }
    for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
      fVar4 = cosf(((float)(int)uVar3 * 6.2831855) / (float)(length + -1));
      window[uVar3] = (1.0 - fVar4) * 0.5;
    }
    return;
  }
  rtc::FatalMessage::FatalMessage
            (&local_190,
             "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/common_audio/window_generator.cc"
             ,0x2a);
  poVar1 = std::operator<<((ostream *)&local_190,"Check failed: window != nullptr");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<(poVar1,"# ");
  rtc::FatalMessage::~FatalMessage(&local_190);
}

Assistant:

void WindowGenerator::Hanning(int length, float* window) {
  RTC_CHECK_GT(length, 1);
  RTC_CHECK(window != nullptr);
  for (int i = 0; i < length; ++i) {
    window[i] = 0.5f * (1 - cosf(2 * static_cast<float>(M_PI) * i /
                                 (length - 1)));
  }
}